

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathNodeSetKeepLast(xmlNodeSetPtr set)

{
  xmlNodePtr *ppxVar1;
  xmlNodePtr ns;
  int iVar2;
  long lVar3;
  
  iVar2 = set->nodeNr;
  if (1 < iVar2) {
    lVar3 = 0;
    while( true ) {
      ppxVar1 = set->nodeTab;
      if (iVar2 + -1 <= lVar3) break;
      ns = ppxVar1[lVar3];
      if ((ns != (xmlNodePtr)0x0) && (ns->type == XML_NAMESPACE_DECL)) {
        xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
        iVar2 = set->nodeNr;
      }
      lVar3 = lVar3 + 1;
    }
    *ppxVar1 = ppxVar1[iVar2 + -1];
    set->nodeNr = 1;
  }
  return;
}

Assistant:

static void
xmlXPathNodeSetKeepLast(xmlNodeSetPtr set)
{
    int i;
    xmlNodePtr node;

    if ((set == NULL) || (set->nodeNr <= 1))
	return;
    for (i = 0; i < set->nodeNr - 1; i++) {
        node = set->nodeTab[i];
        if ((node != NULL) &&
            (node->type == XML_NAMESPACE_DECL))
            xmlXPathNodeSetFreeNs((xmlNsPtr) node);
    }
    set->nodeTab[0] = set->nodeTab[set->nodeNr-1];
    set->nodeNr = 1;
}